

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi_cache.cpp
# Opt level: O2

UBool __thiscall icu_63::RuleBasedBreakIterator::BreakCache::seek(BreakCache *this,int32_t pos)

{
  uint uVar1;
  int32_t *piVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar4 = (ulong)this->fStartBufIdx;
  if (this->fBoundaries[uVar4] <= pos) {
    uVar7 = (ulong)this->fEndBufIdx;
    if (pos <= this->fBoundaries[uVar7]) {
      if (this->fBoundaries[uVar4] == pos) {
        piVar2 = this->fBoundaries + uVar4;
        this->fBufIdx = this->fStartBufIdx;
      }
      else if (this->fBoundaries[uVar7] == pos) {
        piVar2 = this->fBoundaries + uVar7;
        this->fBufIdx = this->fEndBufIdx;
      }
      else {
        while( true ) {
          uVar3 = (uint)uVar4;
          uVar6 = (uint)uVar7;
          if (uVar3 == uVar6) break;
          uVar1 = (int)((uint)((int)uVar6 < (int)uVar3) * 0x80 + uVar6 + uVar3) / 2;
          uVar5 = uVar1 & 0x7f;
          if (this->fBoundaries[uVar5] <= pos) {
            uVar5 = uVar6;
            uVar3 = uVar1 + 1 & 0x7f;
          }
          uVar4 = (ulong)uVar3;
          uVar7 = (ulong)uVar5;
        }
        uVar3 = uVar3 - 1 & 0x7f;
        this->fBufIdx = uVar3;
        piVar2 = this->fBoundaries + uVar3;
      }
      this->fTextIdx = *piVar2;
      return '\x01';
    }
  }
  return '\0';
}

Assistant:

UBool RuleBasedBreakIterator::BreakCache::seek(int32_t pos) {
    if (pos < fBoundaries[fStartBufIdx] || pos > fBoundaries[fEndBufIdx]) {
        return FALSE;
    }
    if (pos == fBoundaries[fStartBufIdx]) {
        // Common case: seek(0), from BreakIterator::first()
        fBufIdx = fStartBufIdx;
        fTextIdx = fBoundaries[fBufIdx];
        return TRUE;
    }
    if (pos == fBoundaries[fEndBufIdx]) {
        fBufIdx = fEndBufIdx;
        fTextIdx = fBoundaries[fBufIdx];
        return TRUE;
    }

    int32_t min = fStartBufIdx;
    int32_t max = fEndBufIdx;
    while (min != max) {
        int32_t probe = (min + max + (min>max ? CACHE_SIZE : 0)) / 2;
        probe = modChunkSize(probe);
        if (fBoundaries[probe] > pos) {
            max = probe;
        } else {
            min = modChunkSize(probe + 1);
        }
    }
    U_ASSERT(fBoundaries[max] > pos);
    fBufIdx = modChunkSize(max - 1);
    fTextIdx = fBoundaries[fBufIdx];
    U_ASSERT(fTextIdx <= pos);
    return TRUE;
}